

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O2

void __thiscall
cppcms::impl::
io_handler_binder_p2<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&,_unsigned_long)>_&,_std::pair<void_*,_unsigned_long>),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&,_unsigned_long)>,_std::pair<void_*,_unsigned_long>_>
::io_handler_binder_p2
          (io_handler_binder_p2<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&,_unsigned_long)>_&,_std::pair<void_*,_unsigned_long>),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&,_unsigned_long)>,_std::pair<void_*,_unsigned_long>_>
           *this,offset_in_fastcgi_to_subr *f,shared_ptr<cppcms::impl::cgi::fastcgi> *s,
          callback<void_(const_std::error_code_&,_unsigned_long)> *p1,
          pair<void_*,_unsigned_long> *p2)

{
  offset_in_fastcgi_to_subr oVar1;
  unsigned_long uVar2;
  
  booster::callable<void_(const_std::error_code_&,_unsigned_long)>::callable
            (&this->super_callable_type);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__io_handler_binder_p2_002b8838;
  oVar1 = f[1];
  this->f_ = *f;
  *(offset_in_fastcgi_to_subr *)&this->field_0x18 = oVar1;
  std::__shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->s_).super___shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>,
             &s->super___shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  intrusive_ptr(&(this->p1_).call_ptr,&p1->call_ptr);
  uVar2 = p2->second;
  (this->p2_).first = p2->first;
  (this->p2_).second = uVar2;
  return;
}

Assistant:

io_handler_binder_p2(F const &f,S const &s, P1 const &p1,P2 const &p2) : f_(f), s_(s), p1_(p1),p2_(p2) {}